

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsBody.cpp
# Opt level: O3

void __thiscall chrono::ChShaftsBody::ArchiveIN(ChShaftsBody *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  undefined **local_38;
  ChVector<double> *local_30;
  char *local_28;
  undefined1 *local_20;
  undefined1 local_18;
  
  ChArchiveIn::VersionRead<chrono::ChShaftsBody>(marchive);
  ChPhysicsItem::ArchiveIN(&this->super_ChPhysicsItem,marchive);
  local_30 = &this->shaft_dir;
  local_28 = "shaft_dir";
  local_18 = 0;
  local_38 = &PTR__ChFunctorArchiveIn_00b03258;
  local_20 = (undefined1 *)&local_38;
  (**(code **)(*(long *)marchive + 0x60))(marchive);
  return;
}

Assistant:

void ChShaftsBody::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChShaftsBody>();

    // deserialize parent class:
    ChPhysicsItem::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(shaft_dir);
    // marchive >> CHNVP(shaft);  //***TODO*** serialize, with shared ptr
    // marchive >> CHNVP(body); //***TODO*** serialize, with shared ptr
}